

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O1

int __thiscall
ncnn::RNN::forward(RNN *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar2;
  int *piVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  void *__dest;
  ulong uVar7;
  void *__src;
  bool bVar8;
  int local_2ac;
  Mat m;
  Mat m_3;
  Mat local_208;
  ulong local_1c0;
  Mat local_1b8;
  Mat m_4;
  Mat m_1;
  Mat m_2;
  Mat m_6;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_1c0 = (ulong)(uint)bottom_blob->h;
  iVar1 = this->direction;
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elemsize._4_4_ = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0x90];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0x90) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0x90,_allocator);
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_208.allocator == (Allocator *)0x0) {
          if (local_208.data != (void *)0x0) {
            free(local_208.data);
          }
        }
        else {
          (*(local_208.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_208.data = m.data;
    local_208.refcount._0_4_ = m.refcount._0_4_;
    local_208.refcount._4_4_ = m.refcount._4_4_;
    local_208.elemsize._0_4_ = (undefined4)m.elemsize;
    local_208.elemsize._4_4_ = m.elemsize._4_4_;
    local_208.elempack = m.elempack;
    local_208.allocator = m.allocator;
    local_208.dims = m.dims;
    local_208.w = m.w;
    local_208.h = m.h;
    local_208.d = m.d;
    local_208.c = m.c;
    local_208.cstep = m.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  else {
    Mat::create(&local_208,this->num_output,(iVar1 == 2) + 1,4,_allocator);
    iVar4 = -100;
    if ((local_208.data == (void *)0x0) || ((long)local_208.c * local_208.cstep == 0))
    goto LAB_0037d46f;
    if (0 < local_208.c * (int)local_208.cstep) {
      memset(local_208.data,0,(ulong)(uint)(local_208.c * (int)local_208.cstep) << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),(int)local_1c0,4,opt->blob_allocator);
  iVar4 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if ((uint)this->direction < 2) {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.c = (this->weight_xc_data).d;
      m.data = (this->weight_xc_data).data;
      uVar7 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar7;
      m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m.d = 1;
      iVar1 = (this->weight_xc_data).dims;
      m.dims = iVar1 + -1;
      m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar1 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.c = (this->bias_c_data).d;
      m_1.data = (this->bias_c_data).data;
      uVar7 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar7;
      m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_1.d = 1;
      iVar1 = (this->bias_c_data).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      uVar7 = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)uVar7;
      m_2.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_2.d = 1;
      sVar5 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->weight_hc_data).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (uVar7 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar1 == 4) {
        m_2.cstep = sVar5;
      }
      local_2ac = rnn(bottom_blob,this_00,this->direction,&m,&m_1,&m_2,&local_208,opt);
      m_2.cstep = 0;
      m_2.data = (void *)0x0;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = 0;
      m_2.elemsize._4_4_ = 0;
      m_2.elempack = 0;
      m_2.dims = 0;
      m_2.w = 0;
      m_2.h = 0;
      m_2.d = 0;
      m_2.c = 0;
      piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      iVar4 = local_2ac;
      if (local_2ac != 0) goto LAB_0037d46f;
    }
    if (this->direction == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,(int)local_1c0,4,opt->workspace_allocator);
      iVar4 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar8 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,(int)local_1c0,4,opt->workspace_allocator);
        iVar4 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar8 = false;
        }
        else {
          m_2.cstep = (size_t)local_208.w;
          m_2.data = local_208.data;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = (undefined4)local_208.elemsize;
          m_2.elemsize._4_4_ = local_208.elemsize._4_4_;
          m_2.elempack = local_208.elempack;
          m_2.allocator = local_208.allocator;
          m_2.w = local_208.w;
          m_2.dims = 2;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          local_1b8.w = (this->weight_xc_data).w;
          local_1b8.h = (this->weight_xc_data).h;
          local_1b8.c = (this->weight_xc_data).d;
          local_1b8.data = (this->weight_xc_data).data;
          uVar7 = (this->weight_xc_data).elemsize;
          local_1b8.elempack = (this->weight_xc_data).elempack;
          local_1b8.allocator = (this->weight_xc_data).allocator;
          local_1b8.refcount._0_4_ = 0;
          local_1b8.refcount._4_4_ = 0;
          local_1b8.elemsize._0_4_ = (undefined4)uVar7;
          local_1b8.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          local_1b8.d = 1;
          uVar6 = (long)local_1b8.h * (long)local_1b8.w;
          iVar1 = (this->weight_xc_data).dims;
          local_1b8.dims = iVar1 + -1;
          local_1b8.cstep = (uVar7 * uVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            local_1b8.cstep = uVar6;
          }
          m_3.w = (this->bias_c_data).w;
          m_3.h = (this->bias_c_data).h;
          m_3.c = (this->bias_c_data).d;
          m_3.data = (this->bias_c_data).data;
          uVar7 = (this->bias_c_data).elemsize;
          m_3.elempack = (this->bias_c_data).elempack;
          m_3.allocator = (this->bias_c_data).allocator;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)uVar7;
          m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_3.d = 1;
          sVar5 = (long)m_3.h * (long)m_3.w;
          iVar1 = (this->bias_c_data).dims;
          m_3.dims = iVar1 + -1;
          m_3.cstep = (uVar7 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            m_3.cstep = sVar5;
          }
          m_4.w = (this->weight_hc_data).w;
          m_4.h = (this->weight_hc_data).h;
          m_4.c = (this->weight_hc_data).d;
          m_4.data = (this->weight_hc_data).data;
          uVar7 = (this->weight_hc_data).elemsize;
          m_4.elempack = (this->weight_hc_data).elempack;
          m_4.allocator = (this->weight_hc_data).allocator;
          m_4.refcount._0_4_ = 0;
          m_4.refcount._4_4_ = 0;
          m_4.elemsize._0_4_ = (undefined4)uVar7;
          m_4.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_4.d = 1;
          sVar5 = (long)m_4.h * (long)m_4.w;
          iVar1 = (this->weight_hc_data).dims;
          m_4.dims = iVar1 + -1;
          m_4.cstep = (uVar7 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            m_4.cstep = sVar5;
          }
          iVar4 = rnn(bottom_blob,&m,0,&local_1b8,&m_3,&m_4,&m_2,opt);
          m_4.cstep = 0;
          m_4.data = (void *)0x0;
          m_4.refcount._0_4_ = 0;
          m_4.refcount._4_4_ = 0;
          m_4.elemsize._0_4_ = 0;
          m_4.elemsize._4_4_ = 0;
          m_4.elempack = 0;
          m_4.dims = 0;
          m_4.w = 0;
          m_4.h = 0;
          m_4.d = 0;
          m_4.c = 0;
          piVar3 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_1b8.allocator == (Allocator *)0x0) {
                if (local_1b8.data != (void *)0x0) {
                  free(local_1b8.data);
                }
              }
              else {
                (*(local_1b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar4 == 0) {
            local_1b8.cstep = (size_t)local_208.w;
            local_1b8.data =
                 (void *)(CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize) *
                          local_1b8.cstep + (long)local_208.data);
            local_1b8.refcount._0_4_ = 0;
            local_1b8.refcount._4_4_ = 0;
            local_1b8.elemsize._0_4_ = (undefined4)local_208.elemsize;
            local_1b8.elemsize._4_4_ = local_208.elemsize._4_4_;
            local_1b8.elempack = local_208.elempack;
            local_1b8.allocator = local_208.allocator;
            local_1b8.w = local_208.w;
            local_1b8.dims = 2;
            local_1b8.h = 1;
            local_1b8.d = 1;
            local_1b8.c = 1;
            m_3.w = (this->weight_xc_data).w;
            m_3.h = (this->weight_xc_data).h;
            m_3.c = (this->weight_xc_data).d;
            uVar7 = (this->weight_xc_data).elemsize;
            m_3.data = (void *)((this->weight_xc_data).cstep * uVar7 +
                               (long)(this->weight_xc_data).data);
            m_3.elempack = (this->weight_xc_data).elempack;
            m_3.allocator = (this->weight_xc_data).allocator;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)uVar7;
            m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_3.d = 1;
            sVar5 = (long)m_3.h * (long)m_3.w;
            iVar1 = (this->weight_xc_data).dims;
            m_3.dims = iVar1 + -1;
            m_3.cstep = (uVar7 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar1 == 4) {
              m_3.cstep = sVar5;
            }
            m_4.w = (this->bias_c_data).w;
            m_4.h = (this->bias_c_data).h;
            m_4.c = (this->bias_c_data).d;
            uVar7 = (this->bias_c_data).elemsize;
            m_4.data = (void *)((this->bias_c_data).cstep * uVar7 + (long)(this->bias_c_data).data);
            m_4.elempack = (this->bias_c_data).elempack;
            m_4.allocator = (this->bias_c_data).allocator;
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = (undefined4)uVar7;
            m_4.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_4.d = 1;
            sVar5 = (long)m_4.h * (long)m_4.w;
            iVar1 = (this->bias_c_data).dims;
            m_4.dims = iVar1 + -1;
            m_4.cstep = (uVar7 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar1 == 4) {
              m_4.cstep = sVar5;
            }
            m_6.w = (this->weight_hc_data).w;
            m_6.h = (this->weight_hc_data).h;
            m_6.c = (this->weight_hc_data).d;
            uVar7 = (this->weight_hc_data).elemsize;
            m_6.data = (void *)((this->weight_hc_data).cstep * uVar7 +
                               (long)(this->weight_hc_data).data);
            m_6.elempack = (this->weight_hc_data).elempack;
            m_6.allocator = (this->weight_hc_data).allocator;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar7;
            m_6.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_6.d = 1;
            sVar5 = (long)m_6.h * (long)m_6.w;
            iVar1 = (this->weight_hc_data).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (uVar7 * sVar5 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar1 == 4) {
              m_6.cstep = sVar5;
            }
            iVar4 = rnn(bottom_blob,&m_1,1,&m_3,&m_4,&m_6,&local_1b8,opt);
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
            piVar3 = (int *)CONCAT44(m_4.refcount._4_4_,m_4.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_4.allocator == (Allocator *)0x0) {
                  if (m_4.data != (void *)0x0) {
                    free(m_4.data);
                  }
                }
                else {
                  (*(m_4.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_4.cstep = 0;
            m_4.data = (void *)0x0;
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = 0;
            m_4.elemsize._4_4_ = 0;
            m_4.elempack = 0;
            m_4.dims = 0;
            m_4.w = 0;
            m_4.h = 0;
            m_4.d = 0;
            m_4.c = 0;
            piVar3 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            bVar8 = iVar4 == 0;
            if ((bVar8) && (iVar4 = local_2ac, 0 < (int)local_1c0)) {
              uVar7 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar7 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar7 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar7 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                       (long)this->num_output << 2);
                uVar7 = uVar7 + 1;
              } while (local_1c0 != uVar7);
            }
            piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_1b8.allocator == (Allocator *)0x0) {
                  if (local_1b8.data != (void *)0x0) {
                    free(local_1b8.data);
                  }
                }
                else {
                  (*(local_1b8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar8 = false;
          }
          local_1b8.cstep = 0;
          local_1b8.c = 0;
          local_1b8.h = 0;
          local_1b8.d = 0;
          local_1b8.dims = 0;
          local_1b8.w = 0;
          local_1b8.elempack = 0;
          local_1b8.elemsize._4_4_ = 0;
          local_1b8.elemsize._0_4_ = 0;
          local_1b8.refcount._4_4_ = 0;
          local_1b8.refcount._0_4_ = 0;
          local_1b8.data = (void *)0x0;
          piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_2.cstep = 0;
          m_2.data = (void *)0x0;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = 0;
          m_2.elemsize._4_4_ = 0;
          m_2.elempack = 0;
          m_2.dims = 0;
          m_2.w = 0;
          m_2.h = 0;
          m_2.d = 0;
          m_2.c = 0;
        }
        piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
      }
      piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      if (!bVar8) goto LAB_0037d46f;
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 0;
    if (((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pMVar2 == 0x90) &&
       (iVar4 = 0, pMVar2 + 1 != &local_208)) {
      piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = pMVar2[1].refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pMVar2[1].allocator == (Allocator *)0x0) {
            if (pMVar2[1].data != (void *)0x0) {
              free(pMVar2[1].data);
            }
          }
          else {
            (*(pMVar2[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar2[1].cstep = 0;
      *(undefined8 *)((long)&pMVar2[1].refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar2[1].elemsize + 4) = 0;
      pMVar2[1].data = (void *)0x0;
      pMVar2[1].refcount = (int *)0x0;
      pMVar2[1].dims = 0;
      pMVar2[1].w = 0;
      pMVar2[1].h = 0;
      pMVar2[1].d = 0;
      pMVar2[1].c = 0;
      pMVar2[1].data = local_208.data;
      pMVar2[1].refcount = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
      pMVar2[1].elemsize = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
      pMVar2[1].elempack = local_208.elempack;
      pMVar2[1].allocator = local_208.allocator;
      pMVar2[1].dims = local_208.dims;
      pMVar2[1].w = local_208.w;
      pMVar2[1].h = local_208.h;
      pMVar2[1].d = local_208.d;
      pMVar2[1].c = local_208.c;
      pMVar2[1].cstep = local_208.cstep;
    }
  }
LAB_0037d46f:
  piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int RNN::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        int ret0 = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        int ret1 = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}